

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::RequiredError::~RequiredError(RequiredError *this)

{
  void *in_RDI;
  
  ~RequiredError((RequiredError *)0x1b2088);
  operator_delete(in_RDI,0x38);
  return;
}

Assistant:

explicit RequiredError(std::string name) : RequiredError(name + " is required", ExitCodes::RequiredError) {}